

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * columnName(sqlite3_stmt *pStmt,int N,int useUtf16,int useType)

{
  byte bVar1;
  sqlite3 *db_00;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  u8 prior_mallocFailed;
  int i;
  sqlite3 *db;
  int n;
  Vdbe *p;
  void *ret;
  u16 *local_28;
  u16 *local_8;
  
  if (in_ESI < 0) {
    local_8 = (u16 *)0x0;
  }
  else {
    local_28 = (u16 *)0x0;
    db_00 = (sqlite3 *)*in_RDI;
    sqlite3_mutex_enter((sqlite3_mutex *)0x14096d);
    if ((*(ushort *)(in_RDI + 0x19) >> 2 & 3) == 0) {
      if (in_ESI < (int)(uint)*(ushort *)(in_RDI + 0x18)) {
        bVar1 = db_00->mallocFailed;
        if (in_EDX == 0) {
          local_28 = (u16 *)sqlite3_value_text((sqlite3_value *)0x140ae6);
        }
        else {
          local_28 = (u16 *)sqlite3_value_text16((sqlite3_value *)0x140ac2);
        }
        if (bVar1 < db_00->mallocFailed) {
          sqlite3OomClear(db_00);
          local_28 = (u16 *)0x0;
        }
      }
    }
    else if (in_ECX < 1) {
      iVar2 = 4;
      if ((*(ushort *)(in_RDI + 0x19) >> 2 & 3) == 1) {
        iVar2 = 8;
      }
      if (in_ESI < iVar2) {
        if (in_EDX == 0) {
          local_28 = (u16 *)azExplainColNames8
                            [(int)(in_ESI + (uint)(*(ushort *)(in_RDI + 0x19) >> 2 & 3) * 8 + -8)];
        }
        else {
          local_28 = azExplainColNames16data +
                     (int)(uint)""[(int)(in_ESI + (uint)(*(ushort *)(in_RDI + 0x19) >> 2 & 3) * 8 +
                                        -8)];
        }
      }
    }
    sqlite3_mutex_leave((sqlite3_mutex *)0x140b22);
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

static const void *columnName(
  sqlite3_stmt *pStmt,     /* The statement */
  int N,                   /* Which column to get the name for */
  int useUtf16,            /* True to return the name as UTF16 */
  int useType              /* What type of name */
){
  const void *ret;
  Vdbe *p;
  int n;
  sqlite3 *db;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pStmt==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  if( N<0 ) return 0;
  ret = 0;
  p = (Vdbe *)pStmt;
  db = p->db;
  assert( db!=0 );
  sqlite3_mutex_enter(db->mutex);

  if( p->explain ){
    if( useType>0 ) goto columnName_end;
    n = p->explain==1 ? 8 : 4;
    if( N>=n ) goto columnName_end;
    if( useUtf16 ){
      int i = iExplainColNames16[N + 8*p->explain - 8];
      ret = (void*)&azExplainColNames16data[i];
    }else{
      ret = (void*)azExplainColNames8[N + 8*p->explain - 8];
    }
    goto columnName_end;
  }
  n = p->nResColumn;
  if( N<n ){
    u8 prior_mallocFailed = db->mallocFailed;
    N += useType*n;
#ifndef SQLITE_OMIT_UTF16
    if( useUtf16 ){
      ret = sqlite3_value_text16((sqlite3_value*)&p->aColName[N]);
    }else
#endif
    {
      ret = sqlite3_value_text((sqlite3_value*)&p->aColName[N]);
    }
    /* A malloc may have failed inside of the _text() call. If this
    ** is the case, clear the mallocFailed flag and return NULL.
    */
    assert( db->mallocFailed==0 || db->mallocFailed==1 );
    if( db->mallocFailed > prior_mallocFailed ){
      sqlite3OomClear(db);
      ret = 0;
    }
  }
columnName_end:
  sqlite3_mutex_leave(db->mutex);
  return ret;
}